

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O0

bool __thiscall
wasm::PossibleConstantValues::combine(PossibleConstantValues *this,PossibleConstantValues *other)

{
  bool bVar1;
  add_pointer_t<const_wasm::PossibleConstantValues::None> ptVar2;
  add_pointer_t<wasm::PossibleConstantValues::None> ptVar3;
  add_pointer_t<wasm::PossibleConstantValues::Many> ptVar4;
  HeapType *pHVar5;
  optional<wasm::HeapType> oVar6;
  Literal local_b8;
  Many local_99;
  uintptr_t local_98;
  uintptr_t local_90;
  _Storage<wasm::HeapType,_true> local_88;
  optional<wasm::HeapType> lub;
  Type local_68;
  HeapType local_60;
  HeapType otherType;
  Literal local_48;
  HeapType local_30;
  HeapType type;
  PossibleConstantValues *other_local;
  PossibleConstantValues *this_local;
  
  ptVar2 = std::
           get_if<wasm::PossibleConstantValues::None,wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                     (&other->value);
  if (ptVar2 == (add_pointer_t<const_wasm::PossibleConstantValues::None>)0x0) {
    ptVar3 = std::
             get_if<wasm::PossibleConstantValues::None,wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                       (&this->value);
    if (ptVar3 == (add_pointer_t<wasm::PossibleConstantValues::None>)0x0) {
      ptVar4 = std::
               get_if<wasm::PossibleConstantValues::Many,wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                         (&this->value);
      if (ptVar4 == (add_pointer_t<wasm::PossibleConstantValues::Many>)0x0) {
        bVar1 = std::operator!=(&other->value,&this->value);
        if (bVar1) {
          std::
          variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
          ::operator=((variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                       *)this,(Many *)((long)&type.id + 7));
          this_local._7_1_ = true;
        }
        else {
          bVar1 = isNull(this);
          if ((bVar1) && (bVar1 = isNull(other), bVar1)) {
            getConstantLiteral(&local_48,this);
            local_30 = wasm::Type::getHeapType(&local_48.type);
            wasm::Literal::~Literal(&local_48);
            getConstantLiteral((Literal *)
                               &lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                super__Optional_payload_base<wasm::HeapType>._M_engaged,other);
            local_60 = wasm::Type::getHeapType(&local_68);
            wasm::Literal::~Literal
                      ((Literal *)
                       &lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_engaged);
            local_90 = local_30.id;
            local_98 = local_60.id;
            oVar6 = HeapType::getLeastUpperBound(local_30,local_60);
            local_88 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
            lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
                 oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_engaged;
            bVar1 = std::optional::operator_cast_to_bool((optional *)&local_88._M_value);
            if (bVar1) {
              pHVar5 = std::optional<wasm::HeapType>::operator*
                                 ((optional<wasm::HeapType> *)&local_88._M_value);
              bVar1 = HeapType::operator!=(pHVar5,&local_30);
              if (bVar1) {
                pHVar5 = std::optional<wasm::HeapType>::operator*
                                   ((optional<wasm::HeapType> *)&local_88._M_value);
                wasm::Literal::makeNull(&local_b8,(HeapType)pHVar5->id);
                std::
                variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                ::operator=((variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                             *)this,&local_b8);
                wasm::Literal::~Literal(&local_b8);
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              std::
              variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
              ::operator=((variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                           *)this,&local_99);
              this_local._7_1_ = true;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      std::
      variant<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      ::operator=(&this->value,&other->value);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool combine(const PossibleConstantValues& other) {
    if (std::get_if<None>(&other.value)) {
      return false;
    }

    if (std::get_if<None>(&value)) {
      value = other.value;
      return true;
    }

    if (std::get_if<Many>(&value)) {
      return false;
    }

    if (other.value != value) {
      value = Many();
      return true;
    }

    // Nulls compare equal, and we could consider any of the input nulls as the
    // combination of the two (as any of them would be valid to place in the
    // location we are working to optimize). In order to have simple symmetric
    // behavior here, which does not depend on the order of the inputs, use the
    // LUB.
    if (isNull() && other.isNull()) {
      auto type = getConstantLiteral().type.getHeapType();
      auto otherType = other.getConstantLiteral().type.getHeapType();
      auto lub = HeapType::getLeastUpperBound(type, otherType);
      if (!lub) {
        // TODO: Remove this workaround once we have bottom types to assign to
        // null literals.
        value = Many();
        return true;
      }
      if (*lub != type) {
        value = Literal::makeNull(*lub);
        return true;
      }
      return false;
    }

    return false;
  }